

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O2

void Test_Template_IncludeWithModifiers::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  TemplateString TVar5;
  TemplateString TVar6;
  Template *tpl;
  Template *tpl_00;
  Template *tpl_01;
  Template *tpl_02;
  Template *tpl_03;
  allocator local_1d9;
  TemplateString local_1d8;
  TemplateDictionary dict;
  uint7 uStack_137;
  uint7 uStack_117;
  uint7 uStack_f7;
  string incname3;
  string incname2;
  string incname;
  TemplateString local_88;
  TemplateString local_68;
  TemplateString local_48;
  
  std::__cxx11::string::string((string *)&dict,"include & print file\n",(allocator *)&incname2);
  ctemplate::StringToTemplateFile(&incname,(string *)&dict);
  std::__cxx11::string::~string((string *)&dict);
  std::__cxx11::string::string((string *)&dict,"inc2\n",(allocator *)&incname3);
  ctemplate::StringToTemplateFile(&incname2,(string *)&dict);
  std::__cxx11::string::~string((string *)&dict);
  std::__cxx11::string::string((string *)&dict,"yo&yo",(allocator *)&local_1d8);
  ctemplate::StringToTemplateFile(&incname3,(string *)&dict);
  std::__cxx11::string::~string((string *)&dict);
  std::__cxx11::string::string((string *)&dict,"hi {{>INC:h}} bar\n",(allocator *)&local_1d8);
  tpl = ctemplate::StringToTemplate((string *)&dict,DO_NOT_STRIP);
  std::__cxx11::string::~string((string *)&dict);
  std::__cxx11::string::string
            ((string *)&dict,"hi {{>INC:javascript_escape}} bar\n",(allocator *)&local_1d8);
  tpl_00 = ctemplate::StringToTemplate((string *)&dict,DO_NOT_STRIP);
  std::__cxx11::string::~string((string *)&dict);
  std::__cxx11::string::string
            ((string *)&dict,"hi {{>INC:pre_escape}} bar\n",(allocator *)&local_1d8);
  tpl_01 = ctemplate::StringToTemplate((string *)&dict,DO_NOT_STRIP);
  std::__cxx11::string::~string((string *)&dict);
  std::__cxx11::string::string((string *)&dict,"hi {{>INC:u}} bar\n",(allocator *)&local_1d8);
  tpl_02 = ctemplate::StringToTemplate((string *)&dict,DO_NOT_STRIP);
  std::__cxx11::string::~string((string *)&dict);
  std::__cxx11::string::string
            ((string *)&dict,"hi {{>INC:h}} bar {{>INC}} baz\n",(allocator *)&local_1d8);
  tpl_03 = ctemplate::StringToTemplate((string *)&dict,DO_NOT_STRIP);
  std::__cxx11::string::~string((string *)&dict);
  ctemplate::TemplateString::TemplateString(&local_1d8,"dict");
  ctemplate::TemplateDictionary::TemplateDictionary(&dict,&local_1d8,(UnsafeArena *)0x0);
  std::__cxx11::string::string((string *)&local_1d8,"hi  bar\n",&local_1d9);
  ctemplate::AssertExpandIs(tpl,&dict,(string *)&local_1d8,true);
  std::__cxx11::string::~string((string *)&local_1d8);
  ctemplate::TemplateString::TemplateString(&local_48,"INC");
  TVar1.length_ = local_48.length_;
  TVar1.ptr_ = local_48.ptr_;
  TVar1.is_immutable_ = local_48.is_immutable_;
  TVar1._17_7_ = local_48._17_7_;
  TVar1.id_ = local_48.id_;
  ctemplate::TemplateDictionary::AddIncludeDictionary(TVar1);
  TVar2.length_ = incname._M_string_length;
  TVar2.ptr_ = incname._M_dataplus._M_p;
  TVar2._16_8_ = (ulong)uStack_f7 << 8;
  TVar2.id_ = 0;
  ctemplate::TemplateDictionary::SetFilename(TVar2);
  std::__cxx11::string::string((string *)&local_1d8,"hi include &amp; print file  bar\n",&local_1d9)
  ;
  ctemplate::AssertExpandIs(tpl,&dict,(string *)&local_1d8,true);
  std::__cxx11::string::~string((string *)&local_1d8);
  ctemplate::TemplateString::TemplateString(&local_68,"INC");
  TVar3.length_ = local_68.length_;
  TVar3.ptr_ = local_68.ptr_;
  TVar3.is_immutable_ = local_68.is_immutable_;
  TVar3._17_7_ = local_68._17_7_;
  TVar3.id_ = local_68.id_;
  ctemplate::TemplateDictionary::AddIncludeDictionary(TVar3);
  TVar4.length_ = incname2._M_string_length;
  TVar4.ptr_ = incname2._M_dataplus._M_p;
  TVar4._16_8_ = (ulong)uStack_117 << 8;
  TVar4.id_ = 0;
  ctemplate::TemplateDictionary::SetFilename(TVar4);
  std::__cxx11::string::string
            ((string *)&local_1d8,"hi include &amp; print file inc2  bar\n",&local_1d9);
  ctemplate::AssertExpandIs(tpl,&dict,(string *)&local_1d8,true);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::string
            ((string *)&local_1d8,"hi include \\x26 print file\\ninc2\\n bar\n",&local_1d9);
  ctemplate::AssertExpandIs(tpl_00,&dict,(string *)&local_1d8,true);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::string
            ((string *)&local_1d8,"hi include &amp; print file\ninc2\n bar\n",&local_1d9);
  ctemplate::AssertExpandIs(tpl_01,&dict,(string *)&local_1d8,true);
  std::__cxx11::string::~string((string *)&local_1d8);
  ctemplate::TemplateString::TemplateString(&local_88,"INC");
  TVar5.length_ = local_88.length_;
  TVar5.ptr_ = local_88.ptr_;
  TVar5.is_immutable_ = local_88.is_immutable_;
  TVar5._17_7_ = local_88._17_7_;
  TVar5.id_ = local_88.id_;
  ctemplate::TemplateDictionary::AddIncludeDictionary(TVar5);
  TVar6.length_ = incname3._M_string_length;
  TVar6.ptr_ = incname3._M_dataplus._M_p;
  TVar6._16_8_ = (ulong)uStack_137 << 8;
  TVar6.id_ = 0;
  ctemplate::TemplateDictionary::SetFilename(TVar6);
  std::__cxx11::string::string
            ((string *)&local_1d8,"hi include+%26+print+file%0Ainc2%0Ayo%26yo bar\n",&local_1d9);
  ctemplate::AssertExpandIs(tpl_02,&dict,(string *)&local_1d8,true);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::string
            ((string *)&local_1d8,
             "hi include &amp; print file inc2 yo&amp;yo bar include & print file\ninc2\nyo&yo baz\n"
             ,&local_1d9);
  ctemplate::AssertExpandIs(tpl_03,&dict,(string *)&local_1d8,true);
  std::__cxx11::string::~string((string *)&local_1d8);
  ctemplate::TemplateDictionary::~TemplateDictionary(&dict);
  std::__cxx11::string::~string((string *)&incname3);
  std::__cxx11::string::~string((string *)&incname2);
  std::__cxx11::string::~string((string *)&incname);
  return;
}

Assistant:

TEST(Template, IncludeWithModifiers) {
  string incname = StringToTemplateFile("include & print file\n");
  string incname2 = StringToTemplateFile("inc2\n");
  string incname3 = StringToTemplateFile("yo&yo");
  // Note this also tests that html-escape, but not javascript-escape or
  // pre-escape, escapes \n to <space>
  Template* tpl1 = StringToTemplate("hi {{>INC:h}} bar\n", DO_NOT_STRIP);
  Template* tpl2 = StringToTemplate("hi {{>INC:javascript_escape}} bar\n",
                                    DO_NOT_STRIP);
  Template* tpl3 = StringToTemplate("hi {{>INC:pre_escape}} bar\n",
                                    DO_NOT_STRIP);
  Template* tpl4 = StringToTemplate("hi {{>INC:u}} bar\n", DO_NOT_STRIP);
  // Test that if we include the same template twice, once with a modifer
  // and once without, they each get applied properly.
  Template* tpl5 = StringToTemplate("hi {{>INC:h}} bar {{>INC}} baz\n",
                                    DO_NOT_STRIP);

  TemplateDictionary dict("dict");
  AssertExpandIs(tpl1, &dict, "hi  bar\n", true);
  dict.AddIncludeDictionary("INC")->SetFilename(incname);
  AssertExpandIs(tpl1, &dict, "hi include &amp; print file  bar\n", true);
  dict.AddIncludeDictionary("INC")->SetFilename(incname2);
  AssertExpandIs(tpl1, &dict, "hi include &amp; print file inc2  bar\n",
                 true);
  AssertExpandIs(tpl2, &dict, "hi include \\x26 print file\\ninc2\\n bar\n",
                 true);
  AssertExpandIs(tpl3, &dict, "hi include &amp; print file\ninc2\n bar\n",
                 true);
  dict.AddIncludeDictionary("INC")->SetFilename(incname3);
  AssertExpandIs(tpl4, &dict,
                 "hi include+%26+print+file%0Ainc2%0Ayo%26yo bar\n",
                 true);
  AssertExpandIs(tpl5, &dict,
                 "hi include &amp; print file inc2 yo&amp;yo bar "
                 "include & print file\ninc2\nyo&yo baz\n",
                 true);

  // Don't test modifier syntax here; that's in TestVariableWithModifiers()
}